

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::LoopUnrollCase::expressionTemplate_abi_cxx11_
          (string *__return_storage_ptr__,LoopUnrollCase *this,CaseType caseType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 1) {
    __s = "value = sin(value)";
    __a = &local_a;
  }
  else if ((int)this == 0) {
    __s = "value += sin(float(${NDX}+1)*valueOrig)";
    __a = &local_9;
  }
  else {
    __a = &local_b;
    __s = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static inline string expressionTemplate (CaseType caseType)
	{
		switch (caseType)
		{
			case CASETYPE_INDEPENDENT:	return "value += sin(float(${NDX}+1)*valueOrig)";
			case CASETYPE_DEPENDENT:	return "value = sin(value)";
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}